

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeFunction * __thiscall
ExpressionContext::GetFunctionType
          (ExpressionContext *this,SynBase *source,TypeBase *returnType,
          IntrusiveList<TypeHandle> arguments)

{
  IntrusiveList<TypeHandle> arguments_00;
  IntrusiveList<TypeHandle> arguments_01;
  IntrusiveList<TypeHandle> arguments_02;
  bool bVar1;
  uint uVar2;
  TypeFunction *this_00;
  byte local_b1;
  byte local_a1;
  TypeFunction *local_a0;
  ExpressionContext *local_98;
  TypeHandle *local_90;
  ExpressionContext *local_88;
  TypeHandle *local_80;
  InplaceStr local_78;
  TypeFunction *local_68;
  TypeFunction *result;
  TypeHandle *local_58;
  TypeFunction *local_50;
  TypeFunction *prev;
  TypeHandle *curr;
  TypeBase *pTStack_38;
  uint hash;
  TypeBase *returnType_local;
  SynBase *source_local;
  ExpressionContext *this_local;
  IntrusiveList<TypeHandle> arguments_local;
  
  arguments_local.head = arguments.tail;
  this_local = (ExpressionContext *)arguments.head;
  pTStack_38 = returnType;
  returnType_local = (TypeBase *)source;
  source_local = (SynBase *)this;
  bVar1 = isType<TypeArgumentSet>(returnType);
  local_a1 = 0;
  if (!bVar1) {
    bVar1 = isType<TypeMemberSet>(pTStack_38);
    local_a1 = 0;
    if (!bVar1) {
      bVar1 = isType<TypeFunctionSet>(pTStack_38);
      local_a1 = bVar1 ^ 0xff;
    }
  }
  if ((local_a1 & 1) == 0) {
    __assert_fail("!isType<TypeArgumentSet>(returnType) && !isType<TypeMemberSet>(returnType) && !isType<TypeFunctionSet>(returnType)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x74d,
                  "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                 );
  }
  bVar1 = isType<TypeError>(pTStack_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isType<TypeError>(returnType)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x74e,
                  "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                 );
  }
  curr._4_4_ = pTStack_38->nameHash;
  prev = (TypeFunction *)this_local;
  while( true ) {
    if (prev == (TypeFunction *)0x0) {
      result = (TypeFunction *)this_local;
      local_58 = arguments_local.head;
      arguments_02.tail = arguments_local.head;
      arguments_02.head = (TypeHandle *)this_local;
      local_50 = GetFunctionTypeFromCache(&this->functionTypeMap,curr._4_4_,pTStack_38,arguments_02)
      ;
      arguments_local.tail = (TypeHandle *)local_50;
      if (local_50 == (TypeFunction *)0x0) {
        this_00 = get<TypeFunction>(this);
        local_88 = this_local;
        local_80 = arguments_local.head;
        arguments_01.tail = arguments_local.head;
        arguments_01.head = (TypeHandle *)this_local;
        local_78 = GetFunctionTypeName(this,pTStack_38,arguments_01);
        local_98 = this_local;
        local_90 = arguments_local.head;
        arguments_00.tail = arguments_local.head;
        arguments_00.head = (TypeHandle *)this_local;
        TypeFunction::TypeFunction(this_00,local_78,pTStack_38,arguments_00);
        local_68 = this_00;
        uVar2 = InplaceStr::length(&(this_00->super_TypeBase).name);
        if (0x2000 < uVar2) {
          Stop(this,(SynBase *)returnType_local,
               "ERROR: generated function type name exceeds maximum type length \'%d\'",0x2000);
        }
        (local_68->super_TypeBase).alignment = 4;
        SmallArray<TypeFunction_*,_128U>::push_back(&this->functionTypes,&local_68);
        local_a0 = local_68;
        SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&local_a0);
        DirectChainedMap<TypeFunction_*>::insert(&this->functionTypeMap,curr._4_4_,local_68);
        arguments_local.tail = (TypeHandle *)local_68;
      }
      return (TypeFunction *)arguments_local.tail;
    }
    bVar1 = isType<TypeArgumentSet>((TypeBase *)(prev->super_TypeBase)._vptr_TypeBase);
    local_b1 = 0;
    if (!bVar1) {
      bVar1 = isType<TypeMemberSet>((TypeBase *)(prev->super_TypeBase)._vptr_TypeBase);
      local_b1 = 0;
      if (!bVar1) {
        bVar1 = isType<TypeFunctionSet>((TypeBase *)(prev->super_TypeBase)._vptr_TypeBase);
        local_b1 = bVar1 ^ 0xff;
      }
    }
    if ((local_b1 & 1) == 0) {
      __assert_fail("!isType<TypeArgumentSet>(curr->type) && !isType<TypeMemberSet>(curr->type) && !isType<TypeFunctionSet>(curr->type)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x754,
                    "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                   );
    }
    bVar1 = isType<TypeError>((TypeBase *)(prev->super_TypeBase)._vptr_TypeBase);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!isType<TypeError>(curr->type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x755,
                    "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
                   );
    }
    if ((TypeBase *)(prev->super_TypeBase)._vptr_TypeBase == this->typeAuto) break;
    curr._4_4_ = curr._4_4_ * 3 + *(int *)((long)(prev->super_TypeBase)._vptr_TypeBase + 0xc);
    prev = *(TypeFunction **)&(prev->super_TypeBase).typeID;
  }
  __assert_fail("curr->type != typeAuto",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x758,
                "TypeFunction *ExpressionContext::GetFunctionType(SynBase *, TypeBase *, IntrusiveList<TypeHandle>)"
               );
}

Assistant:

TypeFunction* ExpressionContext::GetFunctionType(SynBase *source, TypeBase* returnType, IntrusiveList<TypeHandle> arguments)
{
	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(returnType) && !isType<TypeMemberSet>(returnType) && !isType<TypeFunctionSet>(returnType));
	assert(!isType<TypeError>(returnType));

	unsigned hash = returnType->nameHash;

	for(TypeHandle *curr = arguments.head; curr; curr = curr->next)
	{
		assert(!isType<TypeArgumentSet>(curr->type) && !isType<TypeMemberSet>(curr->type) && !isType<TypeFunctionSet>(curr->type));
		assert(!isType<TypeError>(curr->type));

		// Can't have auto as argument
		assert(curr->type != typeAuto);

		hash = (hash << 1) + hash + curr->type->nameHash;
	}

	if(TypeFunction *prev = GetFunctionTypeFromCache(functionTypeMap, hash, returnType, arguments))
		return prev;

	// Create new type
	TypeFunction* result = new (get<TypeFunction>()) TypeFunction(GetFunctionTypeName(*this, returnType, arguments), returnType, arguments);

	if(result->name.length() > NULLC_MAX_TYPE_NAME_LENGTH)
		Stop(source, "ERROR: generated function type name exceeds maximum type length '%d'", NULLC_MAX_TYPE_NAME_LENGTH);

	result->alignment = 4;

	functionTypes.push_back(result);
	types.push_back(result);

	functionTypeMap.insert(hash, result);

	return result;
}